

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng::decompress(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
                        size_t insize,LodePNGDecompressSettings *settings)

{
  uint uVar1;
  size_t buffersize;
  uchar *buffer;
  size_t local_28;
  uchar *local_20;
  
  local_20 = (uchar *)0x0;
  local_28 = 0;
  uVar1 = zlib_decompress(&local_20,&local_28,in,insize,settings);
  if (local_20 != (uchar *)0x0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (const_iterator)
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_20,local_20 + local_28);
    free(local_20);
  }
  return uVar1;
}

Assistant:

unsigned decompress(std::vector<unsigned char>& out, const unsigned char* in, size_t insize,
		const LodePNGDecompressSettings& settings)
	{
		unsigned char* buffer = 0;
		size_t buffersize = 0;
		unsigned error = zlib_decompress(&buffer, &buffersize, in, insize, &settings);
		if (buffer)
		{
			out.insert(out.end(), &buffer[0], &buffer[buffersize]);
			lodepng_free(buffer);
		}
		return error;
	}